

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O0

uint __thiscall
Lib::
BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
::bubbleDown(BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
             *this,uint index)

{
  Comparison CVar1;
  uint in_ESI;
  uint *in_RDI;
  uint nextIndex;
  uint local_18;
  uint local_14;
  
  local_18 = in_ESI << 1;
  local_14 = in_ESI;
  do {
    if (*in_RDI < local_18) {
      return local_14;
    }
    if ((local_18 == *in_RDI) ||
       (CVar1 = FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare::compare
                          (*(Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)local_14 * 8),
                           *(Constraint_Generator **)
                            (*(long *)(in_RDI + 4) + (ulong)(local_18 | 1) * 8)), CVar1 != GREATER))
    {
      CVar1 = FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare::compare
                        (*(Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)local_14 * 8),
                         *(Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)local_18 * 8));
      if (CVar1 != GREATER) {
        return local_14;
      }
      std::swap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator*>
                ((Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)local_14 * 8),
                 (Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)local_18 * 8));
    }
    else {
      CVar1 = FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare::compare
                        (*(Constraint_Generator **)
                          (*(long *)(in_RDI + 4) + (ulong)(local_18 | 1) * 8),
                         *(Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)local_18 * 8));
      if (CVar1 == GREATER) {
        std::swap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator*>
                  ((Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)local_14 * 8),
                   (Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)local_18 * 8));
      }
      else {
        std::swap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator*>
                  ((Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)local_14 * 8),
                   (Constraint_Generator **)(*(long *)(in_RDI + 4) + (ulong)(local_18 | 1) * 8));
        local_18 = local_18 | 1;
      }
    }
    local_14 = local_18;
    local_18 = local_18 << 1;
  } while( true );
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }